

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

void __thiscall icu_63::DecimalFormat::setParseNoExponent(DecimalFormat *this,UBool value)

{
  DecimalFormatProperties *pDVar1;
  
  pDVar1 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  if (pDVar1->parseNoExponent == (bool)value) {
    return;
  }
  pDVar1->parseNoExponent = value != '\0';
  touchNoError(this);
  return;
}

Assistant:

void DecimalFormat::setParseNoExponent(UBool value) {
    if (UBOOL_TO_BOOL(value) == fields->properties->parseNoExponent) { return; }
    fields->properties->parseNoExponent = value;
    touchNoError();
}